

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O0

bool CB_ADF::update_statistics(vw *all,cb_adf *c,example *ec,multi_ex *ec_seq)

{
  bool bVar1;
  iterator scores;
  iterator iVar2;
  reference ppeVar3;
  size_type sVar4;
  reference ppeVar5;
  cb_class *in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  size_t i;
  bool holdout_example;
  bool labeled_example;
  float loss;
  example **example;
  iterator __end1;
  iterator __begin1;
  multi_ex *__range1;
  uint32_t action;
  size_t num_features;
  vector<example_*,_std::allocator<example_*>_> *in_stack_ffffffffffffff98;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
  *in_stack_ffffffffffffffa0;
  ulong uVar6;
  ulong __n;
  bool local_56;
  float local_54;
  cb_class *observation;
  size_t local_28;
  
  local_28 = 0;
  v_array<ACTION_SCORE::action_score>::operator[]
            ((v_array<ACTION_SCORE::action_score> *)(in_RDX + 0x6850),0);
  observation = in_RCX;
  scores = std::vector<example_*,_std::allocator<example_*>_>::begin(in_stack_ffffffffffffff98);
  iVar2 = std::vector<example_*,_std::allocator<example_*>_>::end(in_stack_ffffffffffffff98);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffffa0,
                            (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                             *)in_stack_ffffffffffffff98), bVar1) {
    ppeVar3 = __gnu_cxx::
              __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
              operator*((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                         *)&stack0xffffffffffffffc0);
    local_28 = (*ppeVar3)->num_features + local_28;
    __gnu_cxx::__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
    operator++((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> *
               )&stack0xffffffffffffffc0);
  }
  local_54 = 0.0;
  bVar1 = 0.0 < *(float *)(in_RSI + 0x68);
  if (bVar1) {
    local_54 = CB_ALGS::get_unbiased_cost
                         (observation,(label *)scores._M_current,
                          (uint32_t)((ulong)iVar2._M_current >> 0x20));
  }
  uVar6 = 0;
  local_56 = bVar1;
  while (__n = uVar6,
        sVar4 = std::vector<example_*,_std::allocator<example_*>_>::size
                          ((vector<example_*,_std::allocator<example_*>_> *)in_RCX), uVar6 < sVar4)
  {
    ppeVar5 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        ((vector<example_*,_std::allocator<example_*>_> *)in_RCX,__n);
    local_56 = (local_56 & (*ppeVar5)->test_only & 1U) != 0;
    uVar6 = __n + 1;
  }
  shared_data::update((shared_data *)*in_RDI,local_56,bVar1,local_54,*(float *)(in_RDX + 0x6870),
                      local_28);
  return bVar1;
}

Assistant:

bool update_statistics(vw& all, cb_adf& c, example& ec, multi_ex* ec_seq)
{
  size_t num_features = 0;

  uint32_t action = ec.pred.a_s[0].action;
  for (const auto & example : *ec_seq)
    num_features += example->num_features;

  float loss = 0.;

  bool labeled_example = true;
  if (c.gen_cs.known_cost.probability > 0)
    loss = get_unbiased_cost(&(c.gen_cs.known_cost), c.gen_cs.pred_scores, action);
  else
    labeled_example = false;

  bool holdout_example = labeled_example;
  for (size_t i = 0; i < ec_seq->size(); i++) holdout_example &= (*ec_seq)[i]->test_only;

  all.sd->update(holdout_example, labeled_example, loss, ec.weight, num_features);
  return labeled_example;
}